

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

void P_PlayerOnSpecialFlat(player_t *player,int floorType)

{
  int iVar1;
  APlayerPawn *pAVar2;
  bool bVar3;
  FTerrainDef *pFVar4;
  FSplashDef *pFVar5;
  FSoundID local_34;
  TAngle<double> local_30;
  FName local_28;
  int local_24;
  AInventory *pAStack_20;
  int damage;
  AInventory *ironfeet;
  player_t *ppStack_10;
  int floorType_local;
  player_t *player_local;
  
  ironfeet._4_4_ = floorType;
  ppStack_10 = player;
  pFVar4 = TArray<FTerrainDef,_FTerrainDef>::operator[](&Terrains,(long)floorType);
  iVar1 = level.time;
  if ((pFVar4->DamageAmount != 0) &&
     (pFVar4 = TArray<FTerrainDef,_FTerrainDef>::operator[](&Terrains,(long)ironfeet._4_4_),
     (iVar1 & pFVar4->DamageTimeMask) == 0)) {
    pAStack_20 = (AInventory *)0x0;
    pFVar4 = TArray<FTerrainDef,_FTerrainDef>::operator[](&Terrains,(long)ironfeet._4_4_);
    if ((pFVar4->AllowProtection & 1U) != 0) {
      pAStack_20 = TObjPtr::operator_cast_to_AInventory_
                             ((TObjPtr *)&(ppStack_10->mo->super_AActor).Inventory);
      while ((pAStack_20 != (AInventory *)0x0 &&
             (bVar3 = DObject::IsKindOf((DObject *)pAStack_20,
                                        APowerIronFeet::RegistrationInfo.MyClass), !bVar3))) {
        pAStack_20 = TObjPtr::operator_cast_to_AInventory_
                               ((TObjPtr *)&(pAStack_20->super_AActor).Inventory);
      }
    }
    local_24 = 0;
    if (pAStack_20 == (AInventory *)0x0) {
      pAVar2 = ppStack_10->mo;
      pFVar4 = TArray<FTerrainDef,_FTerrainDef>::operator[](&Terrains,(long)ironfeet._4_4_);
      iVar1 = pFVar4->DamageAmount;
      pFVar4 = TArray<FTerrainDef,_FTerrainDef>::operator[](&Terrains,(long)ironfeet._4_4_);
      FName::FName(&local_28,&pFVar4->DamageMOD);
      TAngle<double>::TAngle(&local_30,0.0);
      local_24 = P_DamageMobj(&pAVar2->super_AActor,(AActor *)0x0,(AActor *)0x0,iVar1,&local_28,0,
                              &local_30);
    }
    if ((0 < local_24) &&
       (pFVar4 = TArray<FTerrainDef,_FTerrainDef>::operator[](&Terrains,(long)ironfeet._4_4_),
       pFVar4->Splash != -1)) {
      pAVar2 = ppStack_10->mo;
      pFVar4 = TArray<FTerrainDef,_FTerrainDef>::operator[](&Terrains,(long)ironfeet._4_4_);
      pFVar5 = TArray<FSplashDef,_FSplashDef>::operator[](&Splashes,(long)pFVar4->Splash);
      FSoundID::FSoundID(&local_34,&pFVar5->NormalSplashSound);
      S_Sound(&pAVar2->super_AActor,0,&local_34,1.0,1.001);
    }
  }
  return;
}

Assistant:

void P_PlayerOnSpecialFlat (player_t *player, int floorType)
{
	if (Terrains[floorType].DamageAmount &&
		!(level.time & Terrains[floorType].DamageTimeMask))
	{
		AInventory *ironfeet = NULL;

		if (Terrains[floorType].AllowProtection)
		{
			for (ironfeet = player->mo->Inventory; ironfeet != NULL; ironfeet = ironfeet->Inventory)
			{
				if (ironfeet->IsKindOf (RUNTIME_CLASS(APowerIronFeet)))
					break;
			}
		}

		int damage = 0;
		if (ironfeet == NULL)
		{
			damage = P_DamageMobj (player->mo, NULL, NULL, Terrains[floorType].DamageAmount,
				Terrains[floorType].DamageMOD);
		}
		if (damage > 0 && Terrains[floorType].Splash != -1)
		{
			S_Sound (player->mo, CHAN_AUTO,
				Splashes[Terrains[floorType].Splash].NormalSplashSound, 1,
				ATTN_IDLE);
		}
	}
}